

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::Unparser::unparseFields(Unparser *this,ObjectFields *fields,bool space_before)

{
  Kind KVar1;
  Hide HVar2;
  ostream *poVar3;
  bool bVar4;
  byte in_DL;
  undefined8 *in_RDI;
  ObjectField *field;
  const_iterator __end2;
  const_iterator __begin2;
  ObjectFields *__range2;
  bool first;
  undefined1 in_stack_00000527;
  AST *in_stack_00000528;
  Unparser *in_stack_00000530;
  ObjectField *in_stack_fffffffffffffef8;
  Unparser *in_stack_ffffffffffffff00;
  string local_88 [48];
  string local_58 [32];
  reference local_38;
  ObjectField *local_30;
  __normal_iterator<const_jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_28 [2];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 1;
  local_28[0]._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin(in_stack_fffffffffffffef8);
  local_30 = (ObjectField *)
             std::
             vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                    *)in_stack_fffffffffffffef8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffef8), bVar4) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
               ::operator*(local_28);
    if ((local_12 & 1) == 0) {
      std::operator<<((ostream *)*in_RDI,',');
    }
    KVar1 = local_38->kind;
    if (KVar1 == ASSERT) {
      in_stack_ffffffffffffff00 = (Unparser *)&local_38->fodder1;
      fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
      std::operator<<((ostream *)*in_RDI,"assert");
      unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
      if (local_38->expr3 != (AST *)0x0) {
        fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
        std::operator<<((ostream *)*in_RDI,":");
        unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
      }
    }
    else if (KVar1 - FIELD_ID < 3) {
      if (local_38->kind == FIELD_ID) {
        fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
        poVar3 = (ostream *)*in_RDI;
        unparse_id_abi_cxx11_((Identifier *)in_stack_fffffffffffffef8);
        std::operator<<(poVar3,local_88);
        std::__cxx11::string::~string(local_88);
      }
      else if (local_38->kind == FIELD_STR) {
        unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
      }
      else if (local_38->kind == FIELD_EXPR) {
        fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
        std::operator<<((ostream *)*in_RDI,"[");
        unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
        fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
        std::operator<<((ostream *)*in_RDI,"]");
      }
      unparseFieldParams(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
      if ((local_38->superSugar & 1U) != 0) {
        std::operator<<((ostream *)*in_RDI,"+");
      }
      HVar2 = local_38->hide;
      if (HVar2 == HIDDEN) {
        std::operator<<((ostream *)*in_RDI,"::");
      }
      else if (HVar2 == INHERIT) {
        std::operator<<((ostream *)*in_RDI,":");
      }
      else if (HVar2 == VISIBLE) {
        std::operator<<((ostream *)*in_RDI,":::");
      }
      unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
    }
    else if (KVar1 == LOCAL) {
      fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
      std::operator<<((ostream *)*in_RDI,"local");
      fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
      poVar3 = (ostream *)*in_RDI;
      unparse_id_abi_cxx11_((Identifier *)in_stack_fffffffffffffef8);
      std::operator<<(poVar3,local_58);
      std::__cxx11::string::~string(local_58);
      unparseFieldParams(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
      std::operator<<((ostream *)*in_RDI,"=");
      unparse(in_stack_00000530,in_stack_00000528,(bool)in_stack_00000527);
    }
    local_12 = 0;
    fill(in_stack_ffffffffffffff00,(Fodder *)in_stack_fffffffffffffef8,false,false);
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void unparseFields(const ObjectFields &fields, bool space_before)
    {
        bool first = true;
        for (const auto &field : fields) {
            if (!first)
                o << ',';

            switch (field.kind) {
                case ObjectField::LOCAL: {
                    fill(field.fodder1, !first || space_before, true);
                    o << "local";
                    fill(field.fodder2, true, true);
                    o << unparse_id(field.id);
                    unparseFieldParams(field);
                    fill(field.opFodder, true, true);
                    o << "=";
                    unparse(field.expr2, true);
                } break;

                case ObjectField::FIELD_ID:
                case ObjectField::FIELD_STR:
                case ObjectField::FIELD_EXPR: {
                    if (field.kind == ObjectField::FIELD_ID) {
                        fill(field.fodder1, !first || space_before, true);
                        o << unparse_id(field.id);

                    } else if (field.kind == ObjectField::FIELD_STR) {
                        unparse(field.expr1, !first || space_before);

                    } else if (field.kind == ObjectField::FIELD_EXPR) {
                        fill(field.fodder1, !first || space_before, true);
                        o << "[";
                        unparse(field.expr1, false);
                        fill(field.fodder2, false, false);
                        o << "]";
                    }
                    unparseFieldParams(field);

                    fill(field.opFodder, false, false);

                    if (field.superSugar)
                        o << "+";
                    switch (field.hide) {
                        case ObjectField::INHERIT: o << ":"; break;
                        case ObjectField::HIDDEN: o << "::"; break;
                        case ObjectField::VISIBLE: o << ":::"; break;
                    }
                    unparse(field.expr2, true);

                } break;

                case ObjectField::ASSERT: {
                    fill(field.fodder1, !first || space_before, true);
                    o << "assert";
                    unparse(field.expr2, true);
                    if (field.expr3 != nullptr) {
                        fill(field.opFodder, true, true);
                        o << ":";
                        unparse(field.expr3, true);
                    }
                } break;
            }

            first = false;
            fill(field.commaFodder, false, false);
        }
    }